

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::UpgradeKeyMetadata(CWallet *this)

{
  bool bVar1;
  LegacyScriptPubKeyMan *pLVar2;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spk_man;
  CWallet *in_stack_00000020;
  LegacyScriptPubKeyMan *in_stack_00000058;
  CWallet *in_stack_ffffffffffffffe8;
  CWallet *this_00;
  
  this_00 = *(CWallet **)(in_FS_OFFSET + 0x28);
  bVar1 = IsLocked(in_RDI);
  if (((!bVar1) && (bVar1 = IsWalletFlagSet(in_stack_ffffffffffffffe8,(uint64_t)in_RDI), !bVar1)) &&
     (pLVar2 = GetLegacyScriptPubKeyMan(this_00), pLVar2 != (LegacyScriptPubKeyMan *)0x0)) {
    LegacyScriptPubKeyMan::UpgradeKeyMetadata(in_stack_00000058);
    SetWalletFlag(in_stack_00000020,(uint64_t)this);
  }
  if (*(CWallet **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::UpgradeKeyMetadata()
{
    if (IsLocked() || IsWalletFlagSet(WALLET_FLAG_KEY_ORIGIN_METADATA)) {
        return;
    }

    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return;
    }

    spk_man->UpgradeKeyMetadata();
    SetWalletFlag(WALLET_FLAG_KEY_ORIGIN_METADATA);
}